

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.hpp
# Opt level: O2

path * __thiscall
vfs::path::combine<std::__cxx11::string>
          (path *__return_storage_ptr__,path *this,path *p0,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *paths)

{
  path pStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  path((path *)&local_38,&p0->pathStr_);
  std::__cxx11::string::string((string *)&pStack_58,&local_38);
  combine_internal(__return_storage_ptr__,this,&pStack_58);
  std::__cxx11::string::~string((string *)&pStack_58);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

static path combine(const path &p0, _Paths &&...paths)
        {
            return combine_internal(p0, combine(std::forward<_Paths>(paths)...));
        }